

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O2

bool FileExist(char *filename)

{
  int iVar1;
  ostream *poVar2;
  allocator local_56;
  allocator local_55;
  Logger local_54;
  string local_50;
  string local_30;
  
  iVar1 = access(filename,0);
  if (iVar1 == -1) {
    local_54.severity_ = WARNING;
    std::__cxx11::string::string
              ((string *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,&local_55);
    std::__cxx11::string::string((string *)&local_50,"FileExist",&local_56);
    poVar2 = Logger::Start(WARNING,&local_30,0x82,&local_50);
    poVar2 = std::operator<<(poVar2,"File: ");
    poVar2 = std::operator<<(poVar2,filename);
    std::operator<<(poVar2," doesn\'t exists.");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    Logger::~Logger(&local_54);
  }
  return iVar1 != -1;
}

Assistant:

inline bool FileExist(const char *filename) {
  if (access(filename, F_OK) != -1) {
    return true;
  }
  LOG(WARNING) << "File: " << filename << " doesn't exists.";
  return false;
}